

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

Violation __thiscall
mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
           *this,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  CtxVal CVar1;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  double dVar2;
  Violation VVar3;
  bool has_arg;
  bool ccon_valid;
  Violation viol;
  int in_stack_ffffffffffffffac;
  Context local_38;
  byte local_32;
  byte local_31;
  double local_30;
  double local_28;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x_00;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffffff0;
  double local_8;
  
  x_00 = in_RDI;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
  GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                 *)0x26fc3d);
  VVar3 = AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>::
          ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (in_stack_fffffffffffffff0,x_00,SUB81((ulong)in_RSI >> 0x38,0));
  local_30 = VVar3.viol_;
  local_28 = VVar3.valX_;
  local_31 = local_30 <= 0.0;
  FunctionalConstraint::GetResultVar((FunctionalConstraint *)in_RDI);
  dVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                    (in_RSI,in_stack_ffffffffffffffac);
  local_32 = 0.5 <= dVar2;
  local_38 = FunctionalConstraint::GetContext((FunctionalConstraint *)in_RDI);
  CVar1 = Context::GetValue(&local_38);
  if (CVar1 == CTX_POS) {
    if ((local_31 & 1) < (local_32 & 1)) {
      local_8 = local_28;
    }
    else {
      local_30 = 0.0;
      local_8 = 0.0;
    }
  }
  else if (CVar1 == CTX_NEG) {
    if ((local_32 & 1) < (local_31 & 1)) {
      local_30 = -local_30;
      local_8 = local_28;
    }
    else {
      local_30 = 0.0;
      local_8 = 0.0;
    }
  }
  else if (CVar1 == CTX_MIX) {
    if ((local_32 & 1) == (local_31 & 1)) {
      local_30 = 0.0;
      local_8 = 0.0;
    }
    else {
      local_30 = ABS(local_30);
      local_8 = local_28;
    }
  }
  else {
    local_30 = INFINITY;
    local_8 = 0.0;
  }
  VVar3.valX_ = local_8;
  VVar3.viol_ = local_30;
  return VVar3;
}

Assistant:

Violation ComputeViolation(const VarVec& x) {
    auto viol = GetConstraint().ComputeViolation(x);
    bool ccon_valid = viol.viol_<=0.0;
    bool has_arg = x[GetResultVar()] >= 0.5;
    switch (this->GetContext().GetValue()) {
    case Context::CTX_MIX:    // Viol is non-positive if holds
      if (has_arg == ccon_valid)
        return {0.0, 0.0};
      return {std::fabs(viol.viol_), viol.valX_};
    case Context::CTX_POS:
      if (has_arg <= ccon_valid)
        return {0.0, 0.0};
      return {viol.viol_, viol.valX_};
    case Context::CTX_NEG:
      if (has_arg >= ccon_valid)
        return {0.0, 0.0};
      return {-viol.viol_, viol.valX_};
    default:
      return {INFINITY, 0.0};
    }
  }